

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm)

{
  uint uVar1;
  uint uVar2;
  BYTE *pBVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  ulong uVar13;
  bool bVar14;
  
  pBVar3 = (ms->window).base;
  uVar10 = (ulong)ms->nextToUpdate;
  if (pBVar3 + uVar10 + 2 <= (BYTE *)((long)end - 8U)) {
    pUVar4 = ms->hashTable;
    uVar1 = (ms->cParams).minMatch;
    pUVar5 = ms->chainTable;
    cVar6 = (char)(ms->cParams).chainLog;
    uVar2 = (ms->cParams).hashLog;
    pBVar11 = pBVar3 + uVar10;
    do {
      uVar9 = 0;
      do {
        switch(uVar1) {
        case 5:
          uVar7 = *(long *)(pBVar3 + uVar9 + uVar10) * -0x30e4432345000000;
          break;
        case 6:
          lVar8 = -0x30e4432340650000;
          goto LAB_00150402;
        case 7:
          lVar8 = -0x30e44323405a9d00;
LAB_00150402:
          uVar7 = lVar8 * *(long *)(pBVar3 + uVar9 + uVar10);
          break;
        case 8:
          uVar7 = *(long *)(pBVar3 + uVar9 + uVar10) * -0x30e44323485a9b9d;
          break;
        default:
          uVar7 = (ulong)((uint)(*(int *)(pBVar3 + uVar9 + uVar10) * -0x61c8864f) >>
                         (0x20U - cVar6 & 0x1f));
          goto LAB_0015040d;
        }
        uVar7 = uVar7 >> (0x40U - cVar6 & 0x3f);
LAB_0015040d:
        uVar13 = (ulong)(*(long *)(pBVar3 + uVar9 + uVar10) * -0x30e44323485a9b9d) >>
                 (0x40U - (char)uVar2 & 0x3f);
        if (uVar9 == 0) {
          pUVar5[uVar7] = (int)pBVar11 - (int)pBVar3;
LAB_00150431:
          pUVar4[uVar13] = (int)uVar10 + (int)uVar9;
        }
        else if (pUVar4[uVar13] == 0) goto LAB_00150431;
      } while ((dtlm != ZSTD_dtlm_fast) && (bVar14 = uVar9 < 2, uVar9 = uVar9 + 1, bVar14));
      pBVar12 = pBVar11 + 5;
      uVar10 = uVar10 + 3;
      pBVar11 = pBVar11 + 3;
    } while (pBVar12 <= (BYTE *)((long)end - 8U));
  }
  return;
}

Assistant:

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t* ms,
                              void const* end, ZSTD_dictTableLoadMethod_e dtlm)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashLarge = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32  const mls = cParams->minMatch;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash tables.
     * Insert the other positions into the large hash table if their entry
     * is empty.
     */
    for (; ip + fastHashFillStep - 1 <= iend; ip += fastHashFillStep) {
        U32 const current = (U32)(ip - base);
        U32 i;
        for (i = 0; i < fastHashFillStep; ++i) {
            size_t const smHash = ZSTD_hashPtr(ip + i, hBitsS, mls);
            size_t const lgHash = ZSTD_hashPtr(ip + i, hBitsL, 8);
            if (i == 0)
                hashSmall[smHash] = current + i;
            if (i == 0 || hashLarge[lgHash] == 0)
                hashLarge[lgHash] = current + i;
            /* Only load extra positions for ZSTD_dtlm_full */
            if (dtlm == ZSTD_dtlm_fast)
                break;
    }   }
}